

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  u8 *puVar1;
  Table *pTVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ExprList_item *pEVar6;
  Expr *pEVar7;
  size_t sVar8;
  u8 uVar9;
  uint uVar10;
  Expr *pEVar11;
  Column *pCVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  Column *local_68;
  
  pTVar2 = pParse->pNewTable;
  if (pTVar2 != (Table *)0x0) {
    if ((pTVar2->tabFlags & 4) == 0) {
      uVar3 = pTVar2->tabFlags | 4;
      pTVar2->tabFlags = uVar3;
      if (pList == (ExprList *)0x0) {
        uVar13 = (long)pTVar2->nCol - 1;
        local_68 = pTVar2->aCol + uVar13;
        puVar1 = &pTVar2->aCol[uVar13].colFlags;
        *puVar1 = *puVar1 | 1;
        bVar17 = true;
LAB_00221de4:
        if ((bVar17) && (local_68 != (Column *)0x0)) {
          if ((local_68->colFlags & 4) == 0) {
            pcVar14 = "";
          }
          else {
            pcVar14 = local_68->zName;
            sVar8 = strlen(pcVar14);
            pcVar14 = pcVar14 + sVar8 + 1;
          }
          iVar5 = sqlite3StrICmp(pcVar14,"INTEGER");
          if ((sortOrder != 1) && (iVar5 == 0)) {
            pTVar2->iPKey = (i16)uVar13;
            pTVar2->keyConf = (u8)onError;
            pTVar2->tabFlags = uVar3 | autoInc << 3;
            if (pList == (ExprList *)0x0) {
              return;
            }
            pParse->iPkSortOrder = pList->a[0].sortOrder;
            goto LAB_00221e7c;
          }
        }
      }
      else {
        iVar5 = pList->nExpr;
        if (0 < (long)iVar5) {
          uVar13 = 0xffffffff;
          lVar16 = 0;
          local_68 = (Column *)0x0;
          do {
            pEVar7 = pList->a[lVar16].pExpr;
            while (pEVar7 != (Expr *)0x0) {
              if ((pEVar7->flags >> 0xc & 1) == 0) goto LAB_00221d01;
              if ((pEVar7->flags >> 0x12 & 1) == 0) {
                pEVar6 = (ExprList_item *)&pEVar7->pLeft;
              }
              else {
                pEVar6 = ((pEVar7->x).pList)->a;
              }
              pEVar7 = pEVar6->pExpr;
            }
            pEVar7 = (Expr *)0x0;
LAB_00221d01:
            uVar9 = pEVar7->op;
            pEVar11 = pEVar7;
            if (uVar9 == 'a') {
LAB_00221d1a:
              pEVar11->op = '\x1b';
              uVar9 = pEVar7->op;
LAB_00221d1f:
              if (uVar9 == '\x1b') {
                uVar10 = (uint)pTVar2->nCol;
                uVar13 = (ulong)uVar10;
                if ((int)uVar10 < 1) {
                  uVar13 = 0;
                }
                else {
                  pcVar14 = (pEVar7->u).zToken;
                  pCVar12 = pTVar2->aCol;
                  uVar15 = 0;
                  do {
                    iVar4 = sqlite3StrICmp(pcVar14,pCVar12->zName);
                    if (iVar4 == 0) {
                      pCVar12->colFlags = pCVar12->colFlags | 1;
                      uVar13 = uVar15 & 0xffffffff;
                      local_68 = pCVar12;
                      break;
                    }
                    uVar15 = uVar15 + 1;
                    pCVar12 = pCVar12 + 1;
                  } while (uVar10 != uVar15);
                }
              }
            }
            else {
              if (uVar9 != '^') goto LAB_00221d1f;
              pEVar11 = pEVar7->pLeft;
              if (pEVar11->op == 'a') goto LAB_00221d1a;
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != iVar5);
          bVar17 = iVar5 == 1;
          goto LAB_00221de4;
        }
      }
      if (autoInc == 0) {
        sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,
                           (Token *)0x0,(Expr *)0x0,sortOrder,0,'\x02');
        return;
      }
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
    }
    else {
      sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar2->zName);
    }
  }
  if (pList == (ExprList *)0x0) {
    return;
  }
LAB_00221e7c:
  exprListDeleteNN(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    pCol->colFlags |= COLFLAG_PRIMKEY;
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zName)==0 ){
            pCol = &pTab->aCol[iCol];
            pCol->colFlags |= COLFLAG_PRIMKEY;
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && sqlite3StrICmp(sqlite3ColumnType(pCol,""), "INTEGER")==0
   && sortOrder!=SQLITE_SO_DESC
  ){
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].sortOrder;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}